

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O0

int __thiscall particleSamples::read_in_particle_samples_mixed_event(particleSamples *this)

{
  size_type sVar1;
  long in_RDI;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *in_stack_00000028;
  particleSamples *in_stack_00000030;
  double in_stack_00000070;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *in_stack_00000078;
  particleSamples *in_stack_00000080;
  particleSamples *in_stack_000000d0;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *in_stack_00000170;
  ifstream *in_stack_00000178;
  particleSamples *in_stack_00000180;
  vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
  *in_stack_00000258;
  particleSamples *in_stack_00000260;
  particleSamples *in_stack_000002c0;
  particleSamples *in_stack_00000440;
  particleSamples *in_stack_00000450;
  particleSamples *in_stack_00000480;
  particleSamples *in_stack_000004a0;
  particleSamples *in_stack_00000640;
  particleSamples *in_stack_00000650;
  particleSamples *in_stack_00000660;
  
  if (*(int *)(in_RDI + 0x5f8) == 0) {
    read_in_particle_samples_OSCAR_mixed_event(in_stack_00000450);
    *(undefined4 *)(in_RDI + 0x618) = 0;
  }
  else if (*(int *)(in_RDI + 0x5f8) == 1) {
    read_in_particle_samples_UrQMD_mixed_event(in_stack_00000650);
  }
  else if (*(int *)(in_RDI + 0x5f8) == 2) {
    read_in_particle_samples_UrQMD_mixed_event_zipped(in_stack_00000660);
  }
  else if (*(int *)(in_RDI + 0x5f8) == 0x15) {
    read_in_particle_samples_UrQMD_mixed_event_binary(in_stack_000002c0);
  }
  else if (*(int *)(in_RDI + 0x5f8) == 3) {
    read_in_particle_samples_mixed_event_Sangwook(in_stack_00000640);
  }
  else if (*(int *)(in_RDI + 0x5f8) == 4) {
    read_in_particle_samples_UrQMD_3p3_mixed_event(in_stack_00000650);
  }
  else if (*(int *)(in_RDI + 0x5f8) == 5) {
    read_in_particle_samples_JAM_mixed_event(in_stack_00000440);
  }
  else if (*(int *)(in_RDI + 0x5f8) == 7) {
    read_in_particle_samples_SMASH_mixed_event_gzipped(in_stack_000004a0);
  }
  else if (*(int *)(in_RDI + 0x5f8) == 8) {
    read_in_particle_samples_SMASH_binary(in_stack_00000180,in_stack_00000178,in_stack_00000170);
  }
  else if (*(int *)(in_RDI + 0x5f8) == 9) {
    read_in_particle_samples_mixed_event_binary(in_stack_000000d0);
  }
  else if (*(int *)(in_RDI + 0x5f8) == 10) {
    read_in_particle_samples_mixed_event_gzipped(in_stack_00000480);
  }
  boostParticles(in_stack_00000080,in_stack_00000078,in_stack_00000070);
  if (*(int *)(in_RDI + 0x614) == 1) {
    perform_resonance_feed_down(in_stack_00000260,in_stack_00000258);
  }
  addParticleQuantumNumber(in_stack_00000030,in_stack_00000028);
  sVar1 = std::
          vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
          ::size(*(vector<std::vector<particle_info,_std::allocator<particle_info>_>_*,_std::allocator<std::vector<particle_info,_std::allocator<particle_info>_>_*>_>
                   **)(in_RDI + 0x698));
  return (int)sVar1;
}

Assistant:

int particleSamples::read_in_particle_samples_mixed_event() {
    if (read_in_mode_ == 0) {
        read_in_particle_samples_OSCAR_mixed_event();
        resonance_weak_feed_down_flag = 0;
    } else if (read_in_mode_ == 1) {
        read_in_particle_samples_UrQMD_mixed_event();
    } else if (read_in_mode_ == 2) {
        read_in_particle_samples_UrQMD_mixed_event_zipped();
    } else if (read_in_mode_ == 21) {
        read_in_particle_samples_UrQMD_mixed_event_binary();
    } else if (read_in_mode_ == 3) {
        read_in_particle_samples_mixed_event_Sangwook();
    } else if (read_in_mode_ == 4) {
        read_in_particle_samples_UrQMD_3p3_mixed_event();
    } else if (read_in_mode_ == 5) {
        read_in_particle_samples_JAM_mixed_event();
    } else if (read_in_mode_ == 7) {
        read_in_particle_samples_SMASH_mixed_event_gzipped();
    } else if (read_in_mode_ == 8) {
        read_in_particle_samples_SMASH_binary(
            inputfile_mixed_event, full_particle_list_mixed_event);
    } else if (read_in_mode_ == 9) {
        read_in_particle_samples_mixed_event_binary();
    } else if (read_in_mode_ == 10) {
        read_in_particle_samples_mixed_event_gzipped();
    }

    boostParticles(full_particle_list_mixed_event, rap_shift_);

    if (resonance_feed_down_flag == 1)
        perform_resonance_feed_down(full_particle_list_mixed_event);
    addParticleQuantumNumber(full_particle_list_mixed_event);
    return (full_particle_list_mixed_event->size());
}